

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

Path * Pathie::Path::global_mutable_data_dir(Path *__return_storage_ptr__,localpathtype local)

{
  _Alloc_hider _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string local_58;
  string local_38;
  
  if ((local == LOCALPATH_LOCAL) ||
     ((local == LOCALPATH_DEFAULT && (c_localdefault == LOCALPATH_LOCAL)))) {
    paVar2 = &local_38.field_2;
    local_38._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"/var/local/lib","");
    Path(__return_storage_ptr__,&local_38);
    _Var1._M_p = local_38._M_dataplus._M_p;
  }
  else {
    paVar2 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"/var/lib","");
    Path(__return_storage_ptr__,&local_58);
    _Var1._M_p = local_58._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var1._M_p != paVar2) {
    operator_delete(_Var1._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::global_mutable_data_dir(localpathtype local)
{
#if defined(_PATHIE_UNIX)
  if (local == Path::LOCALPATH_LOCAL || (local == Path::LOCALPATH_DEFAULT && get_global_dir_default() == Path::LOCALPATH_LOCAL))
    return Path("/var/local/lib");
  else
    return Path("/var/lib");
#elif defined (_WIN32)
  wchar_t dir[MAX_PATH];
  HRESULT result = SHGetFolderPathW(NULL, CSIDL_COMMON_APPDATA, NULL, SHGFP_TYPE_CURRENT, dir);
  if (result != S_OK)
    throw(Pathie::WindowsHresultError(result));

  return Path(utf16_to_utf8(dir));
#else
#error Unsupported system
#endif
}